

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O2

REF_STATUS
ref_gather_plt_brick_zone
          (REF_GRID ref_grid,REF_CELL ref_cell,REF_INT ldim,REF_DBL *scalar,FILE *file)

{
  REF_GLOB *pRVar1;
  undefined4 *puVar2;
  undefined8 *puVar3;
  double dVar4;
  REF_NODE ref_node;
  undefined8 uVar5;
  REF_CELL ref_cell_00;
  FILE *pFVar6;
  uint uVar7;
  REF_STATUS RVar8;
  uint uVar9;
  ulong uVar10;
  size_t sVar11;
  REF_MPI pRVar12;
  void *pvVar13;
  long lVar14;
  undefined8 uVar15;
  REF_MPI pRVar16;
  int iVar17;
  REF_MPI pRVar18;
  char *pcVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  int iVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  REF_INT ncell_1;
  REF_MPI local_268;
  REF_MPI local_260;
  REF_INT part;
  ulong local_250;
  double maxdata;
  REF_CELL local_240;
  REF_MPI local_238;
  FILE *local_230;
  double tempdata;
  double mindata;
  int int_node;
  REF_MPI local_210;
  REF_GLOB *l2c;
  int dataformat;
  REF_GLOB local_1f8 [2];
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  REF_GLOB local_1d8;
  REF_GLOB RStack_1d0;
  REF_GLOB local_1c8;
  REF_GLOB local_1c0;
  int connsharing;
  int varsharing;
  int passive;
  float zonemarker;
  REF_GLOB nnode;
  REF_LONG ncell;
  ulong local_190;
  REF_GLOB globals [27];
  REF_INT nodes [27];
  
  pRVar12 = ref_grid->mpi;
  ref_node = ref_grid->node;
  passive = 0;
  zonemarker = 299.0;
  varsharing = 0;
  dataformat = 2;
  connsharing = -1;
  uVar7 = ref_grid_compact_cell_nodes(ref_grid,ref_cell,&nnode,&ncell,&l2c);
  if (uVar7 != 0) {
    pcVar19 = "l2c";
    uVar15 = 0x104c;
    goto LAB_0013082d;
  }
  local_238 = (REF_MPI)CONCAT44(local_238._4_4_,ldim);
  local_260 = pRVar12;
  if ((nnode < 1) || (ncell < 1)) goto LAB_001316fd;
  local_240 = ref_cell;
  local_230 = (FILE *)file;
  if (pRVar12->id == 0) {
    sVar11 = fwrite(&zonemarker,4,1,(FILE *)file);
    if (sVar11 == 1) {
      iVar17 = -3;
      if (-3 < (REF_INT)local_238) {
        iVar17 = (REF_INT)local_238;
      }
      iVar17 = iVar17 + 4;
      local_210 = (REF_MPI)scalar;
      do {
        pFVar6 = local_230;
        iVar17 = iVar17 + -1;
        if (iVar17 == 0) {
          sVar11 = fwrite(&passive,4,1,local_230);
          if (sVar11 != 1) {
            pcVar19 = "int";
            uVar15 = 0x1059;
            goto LAB_00130f54;
          }
          sVar11 = fwrite(&varsharing,4,1,pFVar6);
          if (sVar11 == 1) {
            sVar11 = fwrite(&connsharing,4,1,pFVar6);
            scalar = (REF_DBL *)local_210;
            if (sVar11 == 1) goto LAB_0013087b;
            pcVar19 = "int";
            uVar15 = 0x105b;
          }
          else {
            pcVar19 = "int";
            uVar15 = 0x105a;
          }
          goto LAB_00130f54;
        }
        sVar11 = fwrite(&dataformat,4,1,local_230);
      } while (sVar11 == 1);
      pcVar19 = "int";
      uVar15 = 0x1056;
    }
    else {
      pcVar19 = "zonemarker";
      uVar15 = 0x1053;
    }
LAB_00130f54:
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar15
           ,"ref_gather_plt_brick_zone",pcVar19,1,sVar11);
    return 1;
  }
LAB_0013087b:
  pRVar18 = (REF_MPI)0x0;
  pRVar12 = local_260;
  local_210 = (REF_MPI)scalar;
  for (local_250 = 0; local_250 != 3; local_250 = local_250 + 1) {
    mindata = 1e+200;
    maxdata = -1e+200;
    uVar10 = (ulong)(uint)ref_node->max;
    if (ref_node->max < 1) {
      uVar10 = 0;
    }
    auVar24 = ZEXT816(0xe974e718d7d7625a);
    tempdata = 1e+200;
    pRVar16 = pRVar18;
    for (uVar20 = 0; uVar10 != uVar20; uVar20 = uVar20 + 1) {
      if ((l2c[uVar20] != -1) && (ref_node->ref_mpi->id == ref_node->part[uVar20])) {
        dVar4 = *(double *)((long)ref_node->real + (long)pRVar16);
        if (dVar4 <= tempdata) {
          tempdata = dVar4;
        }
        dVar4 = *(double *)((long)ref_node->real + (long)pRVar16);
        if (auVar24._0_8_ <= dVar4) {
          auVar24._0_8_ = dVar4;
        }
        maxdata = auVar24._0_8_;
        mindata = tempdata;
      }
      pRVar16 = (REF_MPI)&pRVar16[2].max_tag;
    }
    local_268 = pRVar18;
    uVar7 = ref_mpi_min(pRVar12,&tempdata,&mindata,3);
    if (uVar7 != 0) {
      pcVar19 = "mpi min";
      uVar15 = 0x1068;
      goto LAB_0013082d;
    }
    tempdata = maxdata;
    uVar7 = ref_mpi_max(pRVar12,&tempdata,&maxdata,3);
    pFVar6 = local_230;
    if (uVar7 != 0) {
      pcVar19 = "mpi max";
      uVar15 = 0x106a;
      goto LAB_0013082d;
    }
    if (pRVar12->id == 0) {
      sVar11 = fwrite(&mindata,8,1,local_230);
      if (sVar11 != 1) {
        pcVar19 = "mindata";
        uVar15 = 0x106c;
        goto LAB_00130f54;
      }
      sVar11 = fwrite(&maxdata,8,1,pFVar6);
      pRVar12 = local_260;
      if (sVar11 != 1) {
        pcVar19 = "maxdata";
        uVar15 = 0x106d;
        goto LAB_00130f54;
      }
    }
    pRVar18 = (REF_MPI)&local_268->max_tag;
  }
  local_250 = 0;
  if (0 < (REF_INT)local_238) {
    local_250 = (ulong)local_238 & 0xffffffff;
  }
  lVar22 = (long)(REF_INT)local_238;
  pRVar18 = local_210;
  for (uVar10 = 0; uVar10 != local_250; uVar10 = uVar10 + 1) {
    mindata = 1e+200;
    maxdata = -1e+200;
    uVar20 = (ulong)(uint)ref_node->max;
    if (ref_node->max < 1) {
      uVar20 = 0;
    }
    auVar25 = ZEXT816(0xe974e718d7d7625a);
    tempdata = 1e+200;
    pRVar16 = pRVar18;
    for (uVar21 = 0; uVar20 != uVar21; uVar21 = uVar21 + 1) {
      if ((l2c[uVar21] != -1) && (ref_node->ref_mpi->id == ref_node->part[uVar21])) {
        dVar4 = *(double *)pRVar16;
        if (dVar4 <= tempdata) {
          tempdata = dVar4;
        }
        if (auVar25._0_8_ <= dVar4) {
          auVar25._0_8_ = dVar4;
        }
        maxdata = auVar25._0_8_;
        mindata = tempdata;
      }
      pRVar16 = (REF_MPI)(&pRVar16->n + lVar22 * 2);
    }
    local_268 = pRVar18;
    uVar7 = ref_mpi_min(pRVar12,&tempdata,&mindata,3);
    if (uVar7 != 0) {
      pcVar19 = "mpi min";
      uVar15 = 0x107a;
      goto LAB_0013082d;
    }
    tempdata = maxdata;
    uVar7 = ref_mpi_max(pRVar12,&tempdata,&maxdata,3);
    pFVar6 = local_230;
    if (uVar7 != 0) {
      pcVar19 = "mpi max";
      uVar15 = 0x107c;
      goto LAB_0013082d;
    }
    if (pRVar12->id == 0) {
      sVar11 = fwrite(&mindata,8,1,local_230);
      if (sVar11 != 1) {
        pcVar19 = "mindata";
        uVar15 = 0x107e;
        goto LAB_00130f54;
      }
      sVar11 = fwrite(&maxdata,8,1,pFVar6);
      pRVar12 = local_260;
      if (sVar11 != 1) {
        pcVar19 = "maxdata";
        uVar15 = 0x107f;
        goto LAB_00130f54;
      }
    }
    pRVar18 = (REF_MPI)&local_268->max_tag;
  }
  uVar7 = ref_gather_node_tec_block
                    (ref_node,nnode,l2c,(REF_INT)local_238,(REF_DBL *)local_210,dataformat,
                     (FILE *)local_230);
  pRVar1 = l2c;
  if (uVar7 != 0) {
    pcVar19 = "block points";
    uVar15 = 0x1085;
    goto LAB_0013082d;
  }
  local_268 = ref_node->ref_mpi;
  uVar7 = local_240->node_per;
  local_260 = (REF_MPI)(long)(int)uVar7;
  iVar17 = 0;
  local_210 = (REF_MPI)ncell;
  if (local_268->id == 0) {
    local_238 = (REF_MPI)0x0;
    local_190 = 0;
    if (0 < (int)uVar7) {
      local_190 = (ulong)uVar7;
    }
    for (iVar23 = 0; ref_cell_00 = local_240, iVar23 < local_240->max; iVar23 = iVar23 + 1) {
      RVar8 = ref_cell_nodes(local_240,iVar23,nodes);
      if (RVar8 != 0) goto LAB_001311fc;
      local_250 = CONCAT44(local_250._4_4_,iVar23);
      uVar7 = ref_cell_part(ref_cell_00,ref_node,iVar23,&part);
      if (uVar7 != 0) {
        pcVar19 = "part";
        uVar15 = 0x209;
        goto LAB_00131335;
      }
      if (local_268->id != part) goto LAB_001311f7;
      for (uVar10 = 0; local_190 != uVar10; uVar10 = uVar10 + 1) {
        globals[uVar10] = pRVar1[nodes[uVar10]];
      }
      switch(local_240->node_per) {
      case 4:
        local_1f8[0] = globals[0];
        local_1f8[1] = globals[1];
        local_1d8 = globals[3];
        RStack_1d0 = globals[3];
        local_1c0 = globals[3];
        goto LAB_001311b1;
      case 5:
        local_1f8[0] = globals[0];
        local_1f8[1] = globals[1];
        local_1d8 = globals[3];
        RStack_1d0 = globals[4];
        uStack_1e0 = (undefined4)globals[2];
        uStack_1dc = globals[2]._4_4_;
        local_1c8 = globals[4];
        local_1c0 = globals[3];
        break;
      case 6:
        local_1f8[0] = globals[0];
        local_1f8[1] = globals[1];
        RStack_1d0 = globals[4];
        local_1c0 = globals[5];
LAB_001311b1:
        local_1d8 = globals[3];
        uStack_1e4 = globals[2]._4_4_;
        local_1e8 = (undefined4)globals[2];
        local_1c8 = local_1c0;
        uStack_1e0 = local_1e8;
        uStack_1dc = uStack_1e4;
        break;
      default:
        pcVar19 = "wrong nodes per cell";
        uVar7 = 6;
        uVar15 = 0x21c;
        goto LAB_00131335;
      case 8:
        local_1f8[0] = globals[0];
        local_1f8[1] = globals[1];
        uStack_1e0 = (undefined4)globals[3];
        uStack_1dc = (undefined4)((ulong)globals[3] >> 0x20);
        local_1d8 = globals[4];
        RStack_1d0 = globals[5];
        local_1c8 = globals[6];
        local_1c0 = globals[7];
      }
      uStack_1e4 = globals[2]._4_4_;
      local_1e8 = (undefined4)globals[2];
      local_1f8[1] = globals[1];
      local_1f8[0] = globals[0];
      for (lVar22 = 0; lVar22 != 8; lVar22 = lVar22 + 1) {
        int_node = (int)local_1f8[lVar22];
        pRVar12 = (REF_MPI)fwrite(&int_node,4,1,local_230);
        if (pRVar12 != (REF_MPI)0x1) {
          pcVar19 = "int c2n";
          pRVar18 = (REF_MPI)0x1;
          uVar15 = 0x223;
          goto LAB_0013122d;
        }
      }
      local_238 = (REF_MPI)((long)&local_238->n + 1);
LAB_001311f7:
      iVar23 = (int)local_250;
LAB_001311fc:
    }
    if (local_268->id != 0) goto LAB_00130ea2;
    iVar17 = 1;
    while (pRVar12 = local_268, iVar17 < local_268->n) {
      local_250 = CONCAT44(local_250._4_4_,iVar17);
      uVar7 = ref_mpi_gather_recv(local_268,&ncell_1,1,1,iVar17);
      if (uVar7 != 0) {
        pcVar19 = "recv ncell";
        uVar15 = 0x234;
LAB_00131814:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               uVar15,"ref_gather_brick_tec",(ulong)uVar7,pcVar19);
        goto LAB_0013133c;
      }
      uVar7 = ncell_1 * (int)local_260;
      if ((int)uVar7 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x235,"ref_gather_brick_tec","malloc c2n of REF_GLOB negative");
        goto LAB_00131234;
      }
      pvVar13 = malloc((ulong)uVar7 << 3);
      if (pvVar13 == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x235,"ref_gather_brick_tec","malloc c2n of REF_GLOB NULL");
        uVar7 = 2;
        goto LAB_0013133c;
      }
      uVar7 = ref_mpi_gather_recv(local_268,pvVar13,uVar7,2,(int)local_250);
      if (uVar7 != 0) {
        pcVar19 = "recv c2n";
        uVar15 = 0x238;
        goto LAB_00131814;
      }
      for (lVar22 = 0; lVar22 < ncell_1; lVar22 = lVar22 + 1) {
        switch(local_240->node_per) {
        case 4:
          lVar14 = lVar22 * (long)local_260;
          pRVar1 = (REF_GLOB *)((long)pvVar13 + lVar14 * 8);
          local_1f8[0] = *pRVar1;
          local_1f8[1] = pRVar1[1];
          uVar15 = *(undefined8 *)((long)pvVar13 + lVar14 * 8 + 0x10);
          local_1e8 = (undefined4)uVar15;
          uStack_1e4 = (undefined4)((ulong)uVar15 >> 0x20);
          local_1c0 = *(REF_GLOB *)((long)pvVar13 + lVar14 * 8 + 0x18);
          local_1d8 = local_1c0;
          RStack_1d0 = local_1c0;
          uStack_1e0 = local_1e8;
          uStack_1dc = uStack_1e4;
          goto LAB_0013154c;
        case 5:
          lVar14 = lVar22 * (long)local_260;
          pRVar1 = (REF_GLOB *)((long)pvVar13 + lVar14 * 8);
          local_1f8[0] = *pRVar1;
          local_1f8[1] = pRVar1[1];
          puVar2 = (undefined4 *)((long)pvVar13 + lVar14 * 8 + 0x10);
          local_1e8 = *puVar2;
          uStack_1e4 = puVar2[1];
          auVar24 = *(undefined1 (*) [16])((long)pvVar13 + lVar14 * 8 + 0x18);
          local_1c0 = *(REF_GLOB *)((long)pvVar13 + lVar14 * 8 + 0x18);
          local_1d8 = auVar24._0_8_;
          RStack_1d0 = auVar24._8_8_;
          uStack_1e0 = local_1e8;
          uStack_1dc = uStack_1e4;
          local_1c8 = *(REF_GLOB *)((long)pvVar13 + lVar14 * 8 + 0x20);
          break;
        case 6:
          lVar14 = lVar22 * (long)local_260;
          pRVar1 = (REF_GLOB *)((long)pvVar13 + lVar14 * 8);
          local_1f8[0] = *pRVar1;
          local_1f8[1] = pRVar1[1];
          puVar3 = (undefined8 *)((long)pvVar13 + lVar14 * 8 + 0x10);
          uVar15 = *puVar3;
          local_1e8 = (undefined4)uVar15;
          uStack_1e4 = (undefined4)((ulong)uVar15 >> 0x20);
          local_1d8 = puVar3[1];
          RStack_1d0 = *(REF_GLOB *)((long)pvVar13 + lVar14 * 8 + 0x20);
          local_1c0 = *(REF_GLOB *)((long)pvVar13 + lVar14 * 8 + 0x28);
          uStack_1e0 = local_1e8;
          uStack_1dc = uStack_1e4;
LAB_0013154c:
          local_1c8 = local_1c0;
          local_1e8 = uStack_1e0;
          uStack_1e4 = uStack_1dc;
          break;
        default:
          pcVar19 = "wrong nodes per cell";
          uVar7 = 6;
          uVar15 = 0x248;
          goto LAB_00131335;
        case 8:
          lVar14 = lVar22 * (long)local_260;
          pRVar1 = (REF_GLOB *)((long)pvVar13 + lVar14 * 8);
          local_1f8[0] = *pRVar1;
          local_1f8[1] = pRVar1[1];
          puVar3 = (undefined8 *)((long)pvVar13 + lVar14 * 8 + 0x10);
          uVar15 = *puVar3;
          uVar5 = puVar3[1];
          local_1e8 = (undefined4)uVar15;
          uStack_1e4 = (undefined4)((ulong)uVar15 >> 0x20);
          uStack_1e0 = (undefined4)uVar5;
          uStack_1dc = (undefined4)((ulong)uVar5 >> 0x20);
          pRVar1 = (REF_GLOB *)((long)pvVar13 + lVar14 * 8 + 0x20);
          local_1d8 = *pRVar1;
          RStack_1d0 = pRVar1[1];
          local_1c8 = *(REF_GLOB *)((long)pvVar13 + lVar14 * 8 + 0x30);
          local_1c0 = *(REF_GLOB *)((long)pvVar13 + lVar14 * 8 + 0x38);
        }
        for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
          int_node = (int)local_1f8[lVar14];
          pRVar12 = (REF_MPI)fwrite(&int_node,4,1,local_230);
          if (pRVar12 != (REF_MPI)0x1) {
            pcVar19 = "int c2n";
            pRVar18 = (REF_MPI)0x1;
            uVar15 = 0x24f;
            goto LAB_0013122d;
          }
        }
        local_238 = (REF_MPI)((long)&local_238->n + 1);
      }
      free(pvVar13);
      iVar17 = (int)local_250 + 1;
    }
LAB_001316bd:
    if ((pRVar12->id != 0) || (local_238 == local_210)) {
LAB_001316fd:
      free(l2c);
      return 0;
    }
    pcVar19 = "cell count mismatch";
    uVar15 = 0x274;
    pRVar18 = local_210;
    pRVar12 = local_238;
LAB_0013122d:
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar15
           ,"ref_gather_brick_tec",pcVar19,pRVar18,pRVar12);
LAB_00131234:
    uVar7 = 1;
  }
  else {
    local_238 = (REF_MPI)0x0;
LAB_00130ea2:
    ncell_1 = 0;
    for (; iVar17 < local_240->max; iVar17 = iVar17 + 1) {
      RVar8 = ref_cell_nodes(local_240,iVar17,nodes);
      if (RVar8 == 0) {
        uVar7 = ref_cell_part(local_240,ref_node,iVar17,&part);
        if (uVar7 != 0) {
          pcVar19 = "part";
          uVar15 = 0x25f;
          goto LAB_00131335;
        }
        if (local_268->id == part) {
          ncell_1 = ncell_1 + 1;
        }
      }
    }
    uVar7 = ref_mpi_gather_send(local_268,&ncell_1,1,1);
    pRVar12 = local_260;
    if (uVar7 == 0) {
      uVar7 = 1;
      iVar17 = (int)local_260;
      uVar9 = ncell_1 * iVar17;
      if ((int)uVar9 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x263,"ref_gather_brick_tec","malloc c2n of REF_GLOB negative");
      }
      else {
        pvVar13 = malloc((ulong)uVar9 << 3);
        if (pvVar13 != (void *)0x0) {
          ncell_1 = 0;
          iVar23 = 0;
          uVar10 = 0;
          if (0 < iVar17) {
            uVar10 = (ulong)pRVar12 & 0xffffffff;
          }
          for (; pRVar12 = local_268, iVar23 < local_240->max; iVar23 = iVar23 + 1) {
            RVar8 = ref_cell_nodes(local_240,iVar23,nodes);
            if (RVar8 == 0) {
              uVar7 = ref_cell_part(local_240,ref_node,iVar23,&part);
              if (uVar7 != 0) {
                pcVar19 = "part";
                uVar15 = 0x266;
                goto LAB_00131335;
              }
              if (local_268->id == part) {
                for (uVar20 = 0; uVar10 != uVar20; uVar20 = uVar20 + 1) {
                  *(REF_GLOB *)((long)pvVar13 + uVar20 * 8 + (long)(ncell_1 * (int)local_260) * 8) =
                       pRVar1[nodes[uVar20]];
                }
                ncell_1 = ncell_1 + 1;
              }
            }
          }
          uVar7 = ref_mpi_gather_send(local_268,pvVar13,(int)local_260 * ncell_1,2);
          if (uVar7 == 0) {
            free(pvVar13);
            goto LAB_001316bd;
          }
          pcVar19 = "send c2n";
          uVar15 = 0x26e;
          goto LAB_00131335;
        }
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x263,"ref_gather_brick_tec","malloc c2n of REF_GLOB NULL");
        uVar7 = 2;
      }
    }
    else {
      pcVar19 = "send ncell";
      uVar15 = 0x262;
LAB_00131335:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar15,"ref_gather_brick_tec",(ulong)uVar7,pcVar19);
    }
  }
LAB_0013133c:
  pcVar19 = "c2n";
  uVar15 = 0x1088;
LAB_0013082d:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar15,
         "ref_gather_plt_brick_zone",(ulong)uVar7,pcVar19);
  return uVar7;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_plt_brick_zone(REF_GRID ref_grid,
                                                    REF_CELL ref_cell,
                                                    REF_INT ldim,
                                                    REF_DBL *scalar,
                                                    FILE *file) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  float zonemarker = 299.0;
  REF_LONG ncell;
  REF_GLOB nnode, *l2c;
  int dataformat = 2; /*1=Float, 2=Double*/
  int passive = 0;
  int varsharing = 0;
  int connsharing = -1;
  double mindata, maxdata, tempdata;
  REF_INT node, ixyz, i;

  RSS(ref_grid_compact_cell_nodes(ref_grid, ref_cell, &nnode, &ncell, &l2c),
      "l2c");
  if (nnode <= 0 || ncell <= 0) {
    ref_free(l2c);
    return REF_SUCCESS;
  }

  if (ref_mpi_once(ref_mpi)) {
    REIS(1, fwrite(&zonemarker, sizeof(float), 1, file), "zonemarker");

    for (i = 0; i < 3 + ldim; i++) {
      REIS(1, fwrite(&dataformat, sizeof(int), 1, file), "int");
    }

    REIS(1, fwrite(&passive, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&varsharing, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&connsharing, sizeof(int), 1, file), "int");
  }

  for (ixyz = 0; ixyz < 3; ixyz++) {
    mindata = REF_DBL_MAX;
    maxdata = REF_DBL_MIN;
    for (node = 0; node < ref_node_max(ref_node); node++) {
      if (REF_EMPTY != l2c[node] && ref_node_owned(ref_node, node)) {
        mindata = MIN(mindata, ref_node_xyz(ref_node, ixyz, node));
        maxdata = MAX(maxdata, ref_node_xyz(ref_node, ixyz, node));
      }
    }
    tempdata = mindata;
    RSS(ref_mpi_min(ref_mpi, &tempdata, &mindata, REF_DBL_TYPE), "mpi min");
    tempdata = maxdata;
    RSS(ref_mpi_max(ref_mpi, &tempdata, &maxdata, REF_DBL_TYPE), "mpi max");
    if (ref_mpi_once(ref_mpi)) {
      REIS(1, fwrite(&mindata, sizeof(double), 1, file), "mindata");
      REIS(1, fwrite(&maxdata, sizeof(double), 1, file), "maxdata");
    }
  }
  for (i = 0; i < ldim; i++) {
    mindata = REF_DBL_MAX;
    maxdata = REF_DBL_MIN;
    for (node = 0; node < ref_node_max(ref_node); node++) {
      if (REF_EMPTY != l2c[node] && ref_node_owned(ref_node, node)) {
        mindata = MIN(mindata, scalar[i + ldim * node]);
        maxdata = MAX(maxdata, scalar[i + ldim * node]);
      }
    }
    tempdata = mindata;
    RSS(ref_mpi_min(ref_mpi, &tempdata, &mindata, REF_DBL_TYPE), "mpi min");
    tempdata = maxdata;
    RSS(ref_mpi_max(ref_mpi, &tempdata, &maxdata, REF_DBL_TYPE), "mpi max");
    if (ref_mpi_once(ref_mpi)) {
      REIS(1, fwrite(&mindata, sizeof(double), 1, file), "mindata");
      REIS(1, fwrite(&maxdata, sizeof(double), 1, file), "maxdata");
    }
  }

  RSS(ref_gather_node_tec_block(ref_node, nnode, l2c, ldim, scalar, dataformat,
                                file),
      "block points");

  RSS(ref_gather_brick_tec(ref_node, ref_cell, ncell, l2c, REF_TRUE, file),
      "c2n");

  ref_free(l2c);
  return REF_SUCCESS;
}